

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

GLuint deqp::gls::TextureSamplerTest::createTextureCube(Functions *gl)

{
  GLenum GVar1;
  deUint32 dVar2;
  int face;
  long lVar3;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar4;
  Vec4 local_1a8;
  Vec4 local_198;
  TextureCube refTexture;
  
  local_1a8.m_data[0] = 1.12104e-44;
  local_1a8.m_data[1] = 4.2039e-45;
  tcu::TextureCube::TextureCube(&refTexture,(TextureFormat *)&local_1a8,0x20);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_X,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_Y,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_POSITIVE_Z,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_X,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_Y,0);
  tcu::TextureCube::allocLevel(&refTexture,CUBEFACE_NEGATIVE_Z,0);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[1].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[3].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[5].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[0].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[2].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 0.0;
  local_198.m_data[0] = 1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 1.0;
  tcu::fillWithComponentGradients
            (refTexture.m_access[4].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_1a8,&local_198);
  (*gl->bindTexture)(0x8513,0xffffffff);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1c3);
  pvVar4 = refTexture.m_access;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    dVar2 = glu::getGLCubeFace((CubeFace)lVar3);
    (*gl->texImage2D)(dVar2,0,0x8058,refTexture.m_size,refTexture.m_size,0,0x1908,0x1401,
                      (((pvVar4->
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_data);
    pvVar4 = pvVar4 + 1;
  }
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1ca);
  (*gl->generateMipmap)(0x8513);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glGenerateMipmap(GL_TEXTURE_CUBE_MAP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1cd);
  (*gl->bindTexture)(0x8513,0);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1cf);
  tcu::TextureCube::~TextureCube(&refTexture);
  return 0xffffffff;
}

Assistant:

GLuint TextureSamplerTest::createTextureCube (const glw::Functions& gl)
{
	GLuint				texture		= (GLuint)-1;
	tcu::TextureCube	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), CUBEMAP_SIZE);

	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Z, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Z, 0);

	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		const deUint32 target = glu::getGLCubeFace((tcu::CubeFace)face);
		gl.texImage2D(target, 0, GL_RGBA8, refTexture.getSize(), refTexture.getSize(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevelFace(0, (tcu::CubeFace)face).getDataPtr());
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed");

	gl.generateMipmap(GL_TEXTURE_CUBE_MAP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_CUBE_MAP)");
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	return texture;
}